

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTcpIpLink.cpp
# Opt level: O3

void __thiscall xe::TcpIpLink::closeConnection(TcpIpLink *this)

{
  Socket *this_00;
  deSocketState dVar1;
  deBool dVar2;
  int __how;
  int in_ESI;
  
  this_00 = &this->m_socket;
  dVar1 = deSocket_getState((this->m_socket).m_socket);
  if ((dVar1 != DE_SOCKETSTATE_CLOSED) && (dVar1 != DE_SOCKETSTATE_DISCONNECTED)) {
    de::Socket::shutdown(this_00,in_ESI,__how);
  }
  dVar2 = deTimer_isActive(this->m_keepaliveTimer);
  if (dVar2 != 0) {
    deTimer_disable(this->m_keepaliveTimer);
  }
  if ((this->m_sendThread).m_isRunning == true) {
    TcpIpSendThread::stop(&this->m_sendThread);
  }
  if ((this->m_recvThread).m_isRunning == true) {
    TcpIpRecvThread::stop(&this->m_recvThread);
  }
  dVar1 = deSocket_getState(this_00->m_socket);
  if (dVar1 != DE_SOCKETSTATE_CLOSED) {
    de::Socket::close(this_00,in_ESI);
    return;
  }
  return;
}

Assistant:

void TcpIpLink::closeConnection (void)
{
	{
		deSocketState state = m_socket.getState();
		if (state != DE_SOCKETSTATE_DISCONNECTED && state != DE_SOCKETSTATE_CLOSED)
			m_socket.shutdown();
	}

	if (deTimer_isActive(m_keepaliveTimer))
		deTimer_disable(m_keepaliveTimer);

	if (m_sendThread.isRunning())
		m_sendThread.stop();

	if (m_recvThread.isRunning())
		m_recvThread.stop();

	if (m_socket.getState() != DE_SOCKETSTATE_CLOSED)
		m_socket.close();
}